

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtl_sv.c
# Opt level: O0

void dtl_sv_to_string_internal(dtl_sv_t *self,adt_str_t *str,_Bool *ok)

{
  bool bVar1;
  _Bool _Var2;
  dtl_sv_type_id dVar3;
  uint uVar4;
  uint32_t uVar5;
  int64_t iVar6;
  uint64_t uVar7;
  void *pvVar8;
  float fVar9;
  char local_a8 [7];
  _Bool isNum;
  char numBuf [128];
  _Bool *ok_local;
  adt_str_t *str_local;
  dtl_sv_t *self_local;
  
  bVar1 = false;
  dVar3 = dtl_sv_type(self);
  switch(dVar3) {
  case DTL_SV_NONE:
    if (ok != (_Bool *)0x0) {
      *ok = true;
    }
    adt_str_append_cstr(str,"(undefined)");
    break;
  case DTL_SV_I32:
  case DTL_SV_CHAR:
    if (ok != (_Bool *)0x0) {
      *ok = true;
    }
    uVar4 = dtl_sv_to_i32(self,(_Bool *)0x0);
    sprintf(local_a8,"%d",(ulong)uVar4);
    bVar1 = true;
    break;
  case DTL_SV_U32:
    if (ok != (_Bool *)0x0) {
      *ok = true;
    }
    uVar5 = dtl_sv_to_u32(self,(_Bool *)0x0);
    sprintf(local_a8,"%u",(ulong)uVar5);
    bVar1 = true;
    break;
  case DTL_SV_I64:
    if (ok != (_Bool *)0x0) {
      *ok = true;
    }
    iVar6 = dtl_sv_to_i64(self,(_Bool *)0x0);
    sprintf(local_a8,"%lld",iVar6);
    bVar1 = true;
    break;
  case DTL_SV_U64:
    if (ok != (_Bool *)0x0) {
      *ok = true;
    }
    uVar7 = dtl_sv_to_u64(self,(_Bool *)0x0);
    sprintf(local_a8,"%llu",uVar7);
    bVar1 = true;
    break;
  case DTL_SV_FLT:
    if (ok != (_Bool *)0x0) {
      *ok = true;
    }
    fVar9 = dtl_sv_to_flt(self,(_Bool *)0x0);
    sprintf(local_a8,"%f",(double)fVar9);
    bVar1 = true;
    dtl_sv_ztrim(local_a8);
    break;
  case DTL_SV_DBL:
    if (ok != (_Bool *)0x0) {
      *ok = true;
    }
    dtl_sv_to_dbl(self,(_Bool *)0x0);
    sprintf(local_a8,"%f");
    bVar1 = true;
    dtl_sv_ztrim(local_a8);
    break;
  case DTL_SV_BOOL:
    if (ok != (_Bool *)0x0) {
      *ok = true;
    }
    _Var2 = dtl_sv_to_bool(self,(_Bool *)0x0);
    if (_Var2) {
      adt_str_set_cstr(str,"true");
    }
    else {
      adt_str_set_cstr(str,"false");
    }
    break;
  case DTL_SV_STR:
    if (ok != (_Bool *)0x0) {
      *ok = true;
    }
    adt_str_set(str,(self->pAny->val).str);
    break;
  case DTL_SV_PTR:
    if (ok != (_Bool *)0x0) {
      *ok = true;
    }
    pvVar8 = dtl_sv_to_ptr(self);
    sprintf(local_a8,"%p",pvVar8);
    bVar1 = true;
    break;
  case DTL_SV_DV:
    break;
  case DTL_SV_BYTES:
    break;
  case DTL_SV_BYTEARRAY:
  }
  if (bVar1) {
    adt_str_set_cstr(str,local_a8);
  }
  return;
}

Assistant:

static void dtl_sv_to_string_internal(const dtl_sv_t* self, adt_str_t* str, bool* ok)
{
   char numBuf[MAX_NUM_BUF];
   bool isNum = false;
   switch(dtl_sv_type(self))
   {
   case DTL_SV_NONE:
      if (ok != NULL) *ok = true;
      adt_str_append_cstr(str,"(undefined)");
      break;
   case DTL_SV_I32:
   case DTL_SV_CHAR:
      if (ok != NULL) *ok = true;
      sprintf(numBuf,"%d", (int) dtl_sv_to_i32(self, NULL));
      isNum = true;
      break;
   case DTL_SV_U32:
      if (ok != NULL) *ok = true;
      sprintf(numBuf,"%u", (unsigned int) dtl_sv_to_u32(self, NULL));
      isNum = true;
      break;
   case DTL_SV_I64:
      if (ok != NULL) *ok = true;
      sprintf(numBuf,"%lld", (long long int) dtl_sv_to_i64(self, NULL));
      isNum = true;
      break;
   case DTL_SV_U64:
      if (ok != NULL) *ok = true;
      sprintf(numBuf,"%llu", (long long unsigned int) dtl_sv_to_u64(self, NULL));
      isNum = true;
      break;
   case DTL_SV_FLT:
      if (ok != NULL) *ok = true;
      sprintf(numBuf,"%f", (double) dtl_sv_to_flt(self, NULL));
      isNum = true;
      dtl_sv_ztrim(numBuf);
      break;
   case DTL_SV_DBL:
      if (ok != NULL) *ok = true;
      sprintf(numBuf,"%f", dtl_sv_to_dbl(self, NULL));
      isNum = true;
      dtl_sv_ztrim(numBuf);
      break;
   case DTL_SV_BOOL:
      if (ok != NULL) *ok = true;
      if(dtl_sv_to_bool(self, NULL))
      {
         adt_str_set_cstr(str, "true");
      }
      else
      {
         adt_str_set_cstr(str, "false");
      }
      break;
   case DTL_SV_STR:
      if (ok != NULL) *ok = true;
      adt_str_set(str, self->pAny->val.str);
      break;
   case DTL_SV_PTR:
      if (ok != NULL) *ok = true;
      sprintf(numBuf,"%p", dtl_sv_to_ptr(self));
      isNum = true;
      break;
   case DTL_SV_DV:
      //No conversion available
      break;
   case DTL_SV_BYTES:
      //No conversion available
      break;
   case DTL_SV_BYTEARRAY:
      //No conversion available
      break;
   }
   if(isNum)
   {
      adt_str_set_cstr(str, numBuf);
   }
}